

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_is_gzfile(char *fname)

{
  int iVar1;
  size_t sVar2;
  int len;
  char *fname_local;
  
  if (fname == (char *)0x0) {
    fname_local._4_4_ = 0;
  }
  else {
    sVar2 = strlen(fname);
    if ((int)sVar2 < 3) {
      fname_local._4_4_ = 0;
    }
    else {
      sVar2 = strlen(fname);
      iVar1 = fileext_compare(fname + (sVar2 - 3),".gz");
      if (iVar1 == 0) {
        fname_local._4_4_ = 1;
      }
      else {
        fname_local._4_4_ = 0;
      }
    }
  }
  return fname_local._4_4_;
}

Assistant:

int nifti_is_gzfile(const char* fname)
{
  /* return true if the filename ends with .gz */
  if (fname == NULL) { return 0; }
#ifdef HAVE_ZLIB
  { /* just so len doesn't generate compile warning */
     int len;
     len = (int)strlen(fname);
     if (len < 3) return 0;  /* so we don't search before the name */
     if (fileext_compare(fname + strlen(fname) - 3,".gz")==0) { return 1; }
  }
#endif
  return 0;
}